

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

void Gia_ManSimSimulatePattern(Gia_Man_t *p,char *pFileIn,char *pFileOut)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *vPat_00;
  Vec_Int_t *vPatOut;
  Vec_Int_t *vPat;
  char *pFileOut_local;
  char *pFileIn_local;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManSimReadFile(pFileIn);
  if (p_00 != (Vec_Int_t *)0x0) {
    iVar1 = Vec_IntSize(p_00);
    iVar2 = Gia_ManPiNum(p);
    if (iVar1 % iVar2 == 0) {
      vPat_00 = Gia_ManSimSimulateOne(p,p_00);
      iVar1 = Gia_ManPoNum(p);
      iVar1 = Gia_ManSimWriteFile(pFileOut,vPat_00,iVar1);
      if (iVar1 != 0) {
        printf("Output patterns are written into file \"%s\".\n",pFileOut);
      }
      Vec_IntFree(p_00);
      Vec_IntFree(vPat_00);
    }
    else {
      uVar3 = Vec_IntSize(p_00);
      uVar4 = Gia_ManPiNum(p);
      printf("The number of 0s and 1s in the input file (%d) does not evenly divide by the number of primary inputs (%d).\n"
             ,(ulong)uVar3,(ulong)uVar4);
      Vec_IntFree(p_00);
    }
  }
  return;
}

Assistant:

void Gia_ManSimSimulatePattern( Gia_Man_t * p, char * pFileIn, char * pFileOut )
{
    Vec_Int_t * vPat, * vPatOut;
    vPat = Gia_ManSimReadFile( pFileIn );
    if ( vPat == NULL )
        return;
    if ( Vec_IntSize(vPat) % Gia_ManPiNum(p) )
    {
        printf( "The number of 0s and 1s in the input file (%d) does not evenly divide by the number of primary inputs (%d).\n", 
            Vec_IntSize(vPat), Gia_ManPiNum(p) );
        Vec_IntFree( vPat );
        return;
    }
    vPatOut = Gia_ManSimSimulateOne( p, vPat );
    if ( Gia_ManSimWriteFile( pFileOut, vPatOut, Gia_ManPoNum(p) ) )
        printf( "Output patterns are written into file \"%s\".\n", pFileOut );
    Vec_IntFree( vPat );
    Vec_IntFree( vPatOut );
}